

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

void ot::commissioner::CommissionerApp::MergeDataset
               (CommissionerDataset *aDst,CommissionerDataset *aSrc)

{
  CommissionerDataset *aSrc_local;
  CommissionerDataset *aDst_local;
  
  if ((aSrc->mPresentFlags & 0x8000) != 0) {
    aDst->mBorderAgentLocator = aSrc->mBorderAgentLocator;
    aDst->mPresentFlags = aDst->mPresentFlags | 0x8000;
  }
  if ((aSrc->mPresentFlags & 0x4000) != 0) {
    aDst->mSessionId = aSrc->mSessionId;
    aDst->mPresentFlags = aDst->mPresentFlags | 0x4000;
  }
  if ((aSrc->mPresentFlags & 0x2000) == 0) {
    aDst->mPresentFlags = aDst->mPresentFlags & 0xdfff;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mSteeringData,&aSrc->mSteeringData);
    aDst->mPresentFlags = aDst->mPresentFlags | 0x2000;
  }
  if ((aSrc->mPresentFlags & 0x1000) == 0) {
    aDst->mPresentFlags = aDst->mPresentFlags & 0xefff;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mAeSteeringData,&aSrc->mAeSteeringData);
    aDst->mPresentFlags = aDst->mPresentFlags | 0x1000;
  }
  if ((aSrc->mPresentFlags & 0x800) == 0) {
    aDst->mPresentFlags = aDst->mPresentFlags & 0xf7ff;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mNmkpSteeringData,&aSrc->mNmkpSteeringData);
    aDst->mPresentFlags = aDst->mPresentFlags | 0x800;
  }
  if ((aSrc->mPresentFlags & 0x400) == 0) {
    aDst->mPresentFlags = aDst->mPresentFlags & 0xfbff;
  }
  else {
    aDst->mJoinerUdpPort = aSrc->mJoinerUdpPort;
    aDst->mPresentFlags = aDst->mPresentFlags | 0x400;
  }
  if ((aSrc->mPresentFlags & 0x200) == 0) {
    aDst->mPresentFlags = aDst->mPresentFlags & 0xfdff;
  }
  else {
    aDst->mAeUdpPort = aSrc->mAeUdpPort;
    aDst->mPresentFlags = aDst->mPresentFlags | 0x200;
  }
  if ((aSrc->mPresentFlags & 0x100) == 0) {
    aDst->mPresentFlags = aDst->mPresentFlags & 0xfeff;
  }
  else {
    aDst->mNmkpUdpPort = aSrc->mNmkpUdpPort;
    aDst->mPresentFlags = aDst->mPresentFlags | 0x100;
  }
  return;
}

Assistant:

void CommissionerApp::MergeDataset(CommissionerDataset &aDst, const CommissionerDataset &aSrc)
{
#define SET_IF_PRESENT(name)                                     \
    if (aSrc.mPresentFlags & CommissionerDataset::k##name##Bit)  \
    {                                                            \
        aDst.m##name = aSrc.m##name;                             \
        aDst.mPresentFlags |= CommissionerDataset::k##name##Bit; \
    }

    SET_IF_PRESENT(BorderAgentLocator);
    SET_IF_PRESENT(SessionId);

#undef SET_IF_PRESENT
#define SET_IF_PRESENT(name)                                      \
    if (aSrc.mPresentFlags & CommissionerDataset::k##name##Bit)   \
    {                                                             \
        aDst.m##name = aSrc.m##name;                              \
        aDst.mPresentFlags |= CommissionerDataset::k##name##Bit;  \
    }                                                             \
    else                                                          \
    {                                                             \
        aDst.mPresentFlags &= ~CommissionerDataset::k##name##Bit; \
    }

    SET_IF_PRESENT(SteeringData);
    SET_IF_PRESENT(AeSteeringData);
    SET_IF_PRESENT(NmkpSteeringData);
    SET_IF_PRESENT(JoinerUdpPort);
    SET_IF_PRESENT(AeUdpPort);
    SET_IF_PRESENT(NmkpUdpPort);

#undef SET_IF_PRESENT
}